

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

bool __thiscall
soplex::SPxMainSM<double>::PostStep::checkBasisDim
          (PostStep *this,DataArray<soplex::SPxSolverBase<double>::VarStatus> *rows,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cols)

{
  VarStatus *pVVar1;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_RDX;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_RSI;
  long in_RDI;
  int cs;
  int rs;
  int numBasis;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_1c = 0;
  for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x14); local_20 = local_20 + 1) {
    pVVar1 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_RSI,local_20);
    if (*pVVar1 == BASIC) {
      local_1c = local_1c + 1;
    }
  }
  for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x10); local_24 = local_24 + 1) {
    pVVar1 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_RDX,local_24);
    if (*pVVar1 == BASIC) {
      local_1c = local_1c + 1;
    }
  }
  return local_1c == *(int *)(in_RDI + 0x14);
}

Assistant:

bool SPxMainSM<R>::PostStep::checkBasisDim(DataArray<typename SPxSolverBase<R>::VarStatus> rows,
      DataArray<typename SPxSolverBase<R>::VarStatus> cols) const
{
   int numBasis = 0;

   for(int rs = 0; rs < nRows; ++rs)
   {
      if(rows[rs] == SPxSolverBase<R>::BASIC)
         numBasis++;
   }

   for(int cs = 0; cs < nCols; ++cs)
   {
      if(cols[cs] == SPxSolverBase<R>::BASIC)
         numBasis++;
   }

   assert(numBasis == nRows);
   return numBasis == nRows;
}